

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O0

void __thiscall FGameConfigFile::DoAutoloadSetup(FGameConfigFile *this,FIWadManager *iwad_man)

{
  bool bVar1;
  uint uVar2;
  FString *other;
  char *pcVar3;
  long newlen;
  int local_64;
  long dotpos;
  FString section;
  FString local_40;
  FString workname;
  int num;
  FString *pAuto;
  char *lastver;
  double last;
  FIWadManager *iwad_man_local;
  FGameConfigFile *this_local;
  
  lastver = (char *)0x0;
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,"LastRun",false);
  if ((bVar1) &&
     (pcVar3 = FConfigFile::GetValueForKey(&this->super_FConfigFile,"Version"),
     pcVar3 != (char *)0x0)) {
    lastver = (char *)atof(pcVar3);
  }
  if ((double)lastver < 211.0) {
    FConfigFile::RenameSection(&this->super_FConfigFile,"Chex3.Autoload","chex.chex3.Autoload");
    FConfigFile::RenameSection(&this->super_FConfigFile,"Chex1.Autoload","chex.chex1.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"HexenDK.Autoload","hexen.deathkings.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"HereticSR.Autoload","heretic.shadow.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"FreeDM.Autoload","doom.freedoom.freedm.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Freedoom2.Autoload","doom.freedoom.phase2.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Freedoom1.Autoload","doom.freedoom.phase1.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Freedoom.Autoload","doom.freedoom.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"DoomBFG.Autoload","doom.doom1.bfg.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"DoomU.Autoload","doom.doom1.ultimate.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Doom1.Autoload","doom.doom1.registered.Autoload");
    FConfigFile::RenameSection(&this->super_FConfigFile,"TNT.Autoload","doom.doom2.tnt.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Plutonia.Autoload","doom.doom2.plutonia.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Doom2BFG.Autoload","doom.doom2.bfg.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Doom2.Autoload","doom.doom2.commercial.Autoload");
  }
  workname.Chars._4_4_ = 0;
  do {
    other = FIWadManager::GetAutoname(iwad_man,workname.Chars._4_4_);
    if (other == (FString *)0x0) {
      FConfigFile::CreateSectionAtStart(&this->super_FConfigFile,"Global.Autoload");
      CreateStandardAutoExec(this,"Chex.AutoExec",true);
      CreateStandardAutoExec(this,"Strife.AutoExec",true);
      CreateStandardAutoExec(this,"Hexen.AutoExec",true);
      CreateStandardAutoExec(this,"Heretic.AutoExec",true);
      CreateStandardAutoExec(this,"Doom.AutoExec",true);
      FConfigFile::MoveSectionToStart(&this->super_FConfigFile,"FileSearch.Directories");
      FConfigFile::MoveSectionToStart(&this->super_FConfigFile,"IWADSearch.Directories");
      FConfigFile::SetSectionNote
                (&this->super_FConfigFile,"Doom.AutoExec",
                 "# Files to automatically execute when running the corresponding game.\n# Each file should be on its own line, preceded by Path=\n\n"
                );
      FConfigFile::SetSectionNote
                (&this->super_FConfigFile,"Global.Autoload",
                 "# WAD files to always load. These are loaded after the IWAD but before\n# any files added with -file. Place each file on its own line, preceded\n# by Path=\n"
                );
      FConfigFile::SetSectionNote
                (&this->super_FConfigFile,"Doom.Autoload",
                 "# Wad files to automatically load depending on the game and IWAD you are\n# playing.  You may have have files that are loaded for all similar IWADs\n# (the game) and files that are only loaded for particular IWADs. For example,\n# any files listed under \'doom.Autoload\' will be loaded for any version of Doom,\n# but files listed under \'doom.doom2.Autoload\' will only load when you are\n# playing a Doom 2 based game (doom2.wad, tnt.wad or plutonia.wad), and files listed under\n# \'doom.doom2.commercial.Autoload\' only when playing doom2.wad.\n\n"
                );
      return;
    }
    uVar2 = FIWadManager::GetIWadFlags(iwad_man,workname.Chars._4_4_);
    if ((uVar2 & 2) == 0) {
      FString::FString(&local_40,other);
      do {
        bVar1 = FString::IsNotEmpty(&local_40);
        if (!bVar1) break;
        FString::operator+((FString *)&dotpos,(char *)&local_40);
        pcVar3 = FString::GetChars((FString *)&dotpos);
        FConfigFile::CreateSectionAtStart(&this->super_FConfigFile,pcVar3);
        newlen = FString::LastIndexOf(&local_40,'.');
        if (newlen < 0) {
          local_64 = 6;
        }
        else {
          FString::Truncate(&local_40,newlen);
          local_64 = 0;
        }
        FString::~FString((FString *)&dotpos);
      } while (local_64 == 0);
      FString::~FString(&local_40);
    }
    workname.Chars._4_4_ = workname.Chars._4_4_ + 1;
  } while( true );
}

Assistant:

void FGameConfigFile::DoAutoloadSetup (FIWadManager *iwad_man)
{
	// Create auto-load sections, so users know what's available.
	// Note that this totem pole is the reverse of the order that
	// they will appear in the file.

	double last = 0;
	if (SetSection ("LastRun"))
	{
		const char *lastver = GetValueForKey ("Version");
		if (lastver != NULL) last = atof(lastver);
	}

	if (last < 211)
	{
		RenameSection("Chex3.Autoload", "chex.chex3.Autoload");
		RenameSection("Chex1.Autoload", "chex.chex1.Autoload");
		RenameSection("HexenDK.Autoload", "hexen.deathkings.Autoload");
		RenameSection("HereticSR.Autoload", "heretic.shadow.Autoload");
		RenameSection("FreeDM.Autoload", "doom.freedoom.freedm.Autoload");
		RenameSection("Freedoom2.Autoload", "doom.freedoom.phase2.Autoload");
		RenameSection("Freedoom1.Autoload", "doom.freedoom.phase1.Autoload");
		RenameSection("Freedoom.Autoload", "doom.freedoom.Autoload");
		RenameSection("DoomBFG.Autoload", "doom.doom1.bfg.Autoload");
		RenameSection("DoomU.Autoload", "doom.doom1.ultimate.Autoload");
		RenameSection("Doom1.Autoload", "doom.doom1.registered.Autoload");
		RenameSection("TNT.Autoload", "doom.doom2.tnt.Autoload");
		RenameSection("Plutonia.Autoload", "doom.doom2.plutonia.Autoload");
		RenameSection("Doom2BFG.Autoload", "doom.doom2.bfg.Autoload");
		RenameSection("Doom2.Autoload", "doom.doom2.commercial.Autoload");
	}
	const FString *pAuto;
	for (int num = 0; (pAuto = iwad_man->GetAutoname(num)) != NULL; num++)
	{
		if (!(iwad_man->GetIWadFlags(num) & GI_SHAREWARE))	// we do not want autoload sections for shareware IWADs (which may have an autoname for resource filtering)
		{
			FString workname = *pAuto;

			while (workname.IsNotEmpty())
			{
				FString section = workname + ".Autoload";
				CreateSectionAtStart(section.GetChars());
				long dotpos = workname.LastIndexOf('.');
				if (dotpos < 0) break;
				workname.Truncate(dotpos);
			}
		}
	}
	CreateSectionAtStart("Global.Autoload");

	// The same goes for auto-exec files.
	CreateStandardAutoExec("Chex.AutoExec", true);
	CreateStandardAutoExec("Strife.AutoExec", true);
	CreateStandardAutoExec("Hexen.AutoExec", true);
	CreateStandardAutoExec("Heretic.AutoExec", true);
	CreateStandardAutoExec("Doom.AutoExec", true);

	// Move search paths back to the top.
	MoveSectionToStart("FileSearch.Directories");
	MoveSectionToStart("IWADSearch.Directories");

	SetSectionNote("Doom.AutoExec",
		"# Files to automatically execute when running the corresponding game.\n"
		"# Each file should be on its own line, preceded by Path=\n\n");
	SetSectionNote("Global.Autoload",
		"# WAD files to always load. These are loaded after the IWAD but before\n"
		"# any files added with -file. Place each file on its own line, preceded\n"
		"# by Path=\n");
	SetSectionNote("Doom.Autoload",
		"# Wad files to automatically load depending on the game and IWAD you are\n"
		"# playing.  You may have have files that are loaded for all similar IWADs\n"
		"# (the game) and files that are only loaded for particular IWADs. For example,\n"
		"# any files listed under 'doom.Autoload' will be loaded for any version of Doom,\n"
		"# but files listed under 'doom.doom2.Autoload' will only load when you are\n"
		"# playing a Doom 2 based game (doom2.wad, tnt.wad or plutonia.wad), and files listed under\n"
		"# 'doom.doom2.commercial.Autoload' only when playing doom2.wad.\n\n");
}